

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

char * cmdlineparse(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  undefined8 *puVar3;
  long in_RSI;
  int in_EDI;
  int i;
  int fileno;
  undefined7 in_stack_fffffffffffffe98;
  byte in_stack_fffffffffffffe9f;
  ConsoleLogger *in_stack_fffffffffffffea0;
  allocator *in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffeb0;
  byte in_stack_fffffffffffffeb7;
  allocator local_e9;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  int local_18;
  int local_14;
  long local_10;
  int local_4;
  
  local_14 = 0;
  local_10 = in_RSI;
  local_4 = in_EDI;
  for (local_18 = 1; local_18 < local_4; local_18 = local_18 + 1) {
    pcVar1 = *(char **)(local_10 + (long)local_18 * 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,pcVar1,&local_39);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffea0,
                            (char *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    if (bVar2) {
      console.loglevel = 2;
    }
    else {
      pcVar1 = *(char **)(local_10 + (long)local_18 * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,pcVar1,&local_71);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffea0,
                              (char *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98))
      ;
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
      if (bVar2) {
        opt_preview = true;
      }
      else {
        pcVar1 = *(char **)(local_10 + (long)local_18 * 8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_98,pcVar1,&local_99);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffea0,
                                (char *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98
                                                ));
        std::__cxx11::string::~string(local_98);
        std::allocator<char>::~allocator((allocator<char> *)&local_99);
        if (bVar2) {
          opt_albedo = true;
        }
        else {
          pcVar1 = *(char **)(local_10 + (long)local_18 * 8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_c0,pcVar1,&local_c1);
          in_stack_fffffffffffffeb7 =
               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffea0,
                               (char *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98)
                              );
          std::__cxx11::string::~string(local_c0);
          std::allocator<char>::~allocator((allocator<char> *)&local_c1);
          if ((in_stack_fffffffffffffeb7 & 1) == 0) {
            in_stack_fffffffffffffea0 = *(ConsoleLogger **)(local_10 + (long)local_18 * 8);
            in_stack_fffffffffffffea8 = &local_e9;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_e8,(char *)in_stack_fffffffffffffea0,in_stack_fffffffffffffea8);
            in_stack_fffffffffffffe9f =
                 std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffffea0,
                                 (char *)CONCAT17(in_stack_fffffffffffffe9f,
                                                  in_stack_fffffffffffffe98));
            std::__cxx11::string::~string(local_e8);
            std::allocator<char>::~allocator((allocator<char> *)&local_e9);
            if ((in_stack_fffffffffffffe9f & 1) == 0) {
              local_14 = local_18;
            }
            else {
              local_18 = local_18 + 1;
              opt_spp = atoi(*(char **)(local_10 + (long)local_18 * 8));
            }
          }
          else {
            opt_normal = true;
          }
        }
      }
    }
  }
  if (local_14 != 0) {
    return *(char **)(local_10 + (long)local_14 * 8);
  }
  github111116::ConsoleLogger::info<char[7],char*,char[23]>
            ((ConsoleLogger *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
             (char (*) [7])in_stack_fffffffffffffea8,(char **)in_stack_fffffffffffffea0,
             (char (*) [23])CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  github111116::ConsoleLogger::log<char[9]>
            (in_stack_fffffffffffffea0,
             (char (*) [9])CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  github111116::ConsoleLogger::log<char[49]>
            (in_stack_fffffffffffffea0,
             (char (*) [49])CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  github111116::ConsoleLogger::log<char[45]>
            (in_stack_fffffffffffffea0,
             (char (*) [45])CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  github111116::ConsoleLogger::log<char[51]>
            (in_stack_fffffffffffffea0,
             (char (*) [51])CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  github111116::ConsoleLogger::log<char[61]>
            (in_stack_fffffffffffffea0,
             (char (*) [61])CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  github111116::ConsoleLogger::log<char[61]>
            (in_stack_fffffffffffffea0,
             (char (*) [61])CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "scene not specified.";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

const char* cmdlineparse(int argc, char* argv[]) {
#ifndef NDEBUG
	console.warn("Running in DEBUG mode. EXTREMELY SLOW!\n");
#endif
	int fileno = 0;
	for (int i=1; i<argc; ++i) {
		if (std::string(argv[i]) == "--quiet")
			console.loglevel = 2;
		else if (std::string(argv[i]) == "--preview")
			opt_preview = true;
		else if (std::string(argv[i]) == "--albedo")
			opt_albedo = true;
		else if (std::string(argv[i]) == "--normal")
			opt_normal = true;
		else if (std::string(argv[i]) == "--spp")
			opt_spp = atoi(argv[++i]);
		else {
			fileno = i;
		}
	}
	if (!fileno) {
		console.info("Usage:", argv[0], "[options] <scene json>");
		console.log ("Options:");
		console.log ("  --quiet          Only show warnings and errors");
		console.log ("  --preview        Render with lower quality");
		console.log ("  --spp <n>        Render with n samples per pixel");
		console.log ("  --albedo         Output albedo buffer to albedo-[filename]");
		console.log ("  --normal         Output normal buffer to normal-[filename]");
		throw "scene not specified.";
	}
	return argv[fileno];
}